

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpapiex.c
# Opt level: O0

int buildResponseHttpHeadersHandle
              (HTTP_HEADERS_HANDLE originalResponsetHttpHeadersHandle,
              _Bool *isOriginalResponseHttpHeadersHandle,
              HTTP_HEADERS_HANDLE *toBeUsedResponsetHttpHeadersHandle)

{
  HTTP_HEADERS_HANDLE pHVar1;
  undefined4 local_24;
  int result;
  HTTP_HEADERS_HANDLE *toBeUsedResponsetHttpHeadersHandle_local;
  _Bool *isOriginalResponseHttpHeadersHandle_local;
  HTTP_HEADERS_HANDLE originalResponsetHttpHeadersHandle_local;
  
  if (originalResponsetHttpHeadersHandle == (HTTP_HEADERS_HANDLE)0x0) {
    pHVar1 = HTTPHeaders_Alloc();
    *toBeUsedResponsetHttpHeadersHandle = pHVar1;
    if (pHVar1 == (HTTP_HEADERS_HANDLE)0x0) {
      local_24 = 0xbf;
    }
    else {
      *isOriginalResponseHttpHeadersHandle = false;
      local_24 = 0;
    }
  }
  else {
    *isOriginalResponseHttpHeadersHandle = true;
    *toBeUsedResponsetHttpHeadersHandle = originalResponsetHttpHeadersHandle;
    local_24 = 0;
  }
  return local_24;
}

Assistant:

static int buildResponseHttpHeadersHandle(HTTP_HEADERS_HANDLE originalResponsetHttpHeadersHandle, bool* isOriginalResponseHttpHeadersHandle, HTTP_HEADERS_HANDLE* toBeUsedResponsetHttpHeadersHandle)
{
    int result;
    if (originalResponsetHttpHeadersHandle == NULL)
    {
        if ((*toBeUsedResponsetHttpHeadersHandle = HTTPHeaders_Alloc()) == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            *isOriginalResponseHttpHeadersHandle = false;
            result = 0;
        }
    }
    else
    {
        *isOriginalResponseHttpHeadersHandle = true;
        *toBeUsedResponsetHttpHeadersHandle = originalResponsetHttpHeadersHandle;
        result = 0;
    }
    return result;
}